

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          lexeme_t<cfgfile::qstring_trait_t> *lexeme,tag_t<cfgfile::qstring_trait_t> *tag)

{
  bool bVar1;
  lexeme_type_t lVar2;
  undefined8 uVar3;
  input_stream_t<cfgfile::qstring_trait_t> *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  string_t *line_number;
  string_t *file_name;
  tag_t<cfgfile::qstring_trait_t> *in_RDX;
  lexeme_t<cfgfile::qstring_trait_t> *in_RSI;
  long in_RDI;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *this_01;
  qstring_wrapper_t *in_stack_fffffffffffffb48;
  stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *in_stack_fffffffffffffb50;
  string_t *in_stack_fffffffffffffb58;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffb60;
  allocator<char> *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined1 local_408 [40];
  tag_t<cfgfile::qstring_trait_t> *local_3e0;
  undefined1 local_3d2;
  string local_379 [6];
  undefined1 local_29a;
  undefined1 local_162;
  tag_t<cfgfile::qstring_trait_t> *local_20;
  lexeme_t<cfgfile::qstring_trait_t> *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar2 = lexeme_t<cfgfile::qstring_trait_t>::type(in_RSI);
  if (lVar2 == start) {
    local_162 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
    piVar4 = lexical_analyzer_t<cfgfile::qstring_trait_t>::input_stream
                       ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
    input_stream_t<cfgfile::qstring_trait_t>::file_name(piVar4);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
              (qstring_wrapper_t *)in_stack_fffffffffffffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
              (qstring_wrapper_t *)in_stack_fffffffffffffb80);
    lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
              ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
    qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffb88);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
              (qstring_wrapper_t *)in_stack_fffffffffffffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80
              );
    qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
              (qstring_wrapper_t *)in_stack_fffffffffffffb80);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_162 = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  lVar2 = lexeme_t<cfgfile::qstring_trait_t>::type(local_18);
  if (lVar2 != finish) {
    lVar2 = lexeme_t<cfgfile::qstring_trait_t>::type(local_18);
    if (lVar2 != null) {
      tag_t<cfgfile::qstring_trait_t>::name(local_20);
      lexeme_t<cfgfile::qstring_trait_t>::value(local_18);
      bVar1 = cfgfile::operator==((qstring_wrapper_t *)in_stack_fffffffffffffb50,
                                  in_stack_fffffffffffffb48);
      if (bVar1) {
        local_3e0 = local_20;
        std::
        stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::push(in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
        this_01 = (lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60);
        piVar4 = lexical_analyzer_t<cfgfile::qstring_trait_t>::input_stream(this_01);
        line_number = input_stream_t<cfgfile::qstring_trait_t>::file_name(piVar4);
        file_name = (string_t *)lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number(this_01);
        lexical_analyzer_t<cfgfile::qstring_trait_t>::column_number(this_01);
        parser_info_t<cfgfile::qstring_trait_t>::parser_info_t
                  ((parser_info_t<cfgfile::qstring_trait_t> *)local_20,file_name,(pos_t)line_number,
                   (pos_t)this_01);
        (*(code *)(((string_t *)&local_20->_vptr_tag_t)->m_str).d.d[2].super_QArrayData.alloc)
                  (local_20,local_408);
        parser_info_t<cfgfile::qstring_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::qstring_trait_t> *)0x138a0f);
      }
      return bVar1;
    }
    local_3d2 = 1;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
    piVar4 = lexical_analyzer_t<cfgfile::qstring_trait_t>::input_stream
                       ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
    input_stream_t<cfgfile::qstring_trait_t>::file_name(piVar4);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
              (qstring_wrapper_t *)in_stack_fffffffffffffb80);
    str = local_379;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)str,in_stack_fffffffffffffb80);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)in_stack_fffffffffffffb80);
    __a = (allocator<char> *)
          lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
                    ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
    qstring_trait_t::to_string((pos_t)str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)str,__a);
    qstring_trait_t::from_ascii(str);
    operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_3d2 = 0;
    __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  local_29a = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
  piVar4 = lexical_analyzer_t<cfgfile::qstring_trait_t>::input_stream
                     ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
  input_stream_t<cfgfile::qstring_trait_t>::file_name(piVar4);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
            (qstring_wrapper_t *)in_stack_fffffffffffffb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
            (qstring_wrapper_t *)in_stack_fffffffffffffb80);
  lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
            ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
  qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffb88);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
            (qstring_wrapper_t *)in_stack_fffffffffffffb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  qstring_trait_t::from_ascii(in_stack_fffffffffffffb88);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffb88,
            (qstring_wrapper_t *)in_stack_fffffffffffffb80);
  exception_t<cfgfile::qstring_trait_t>::exception_t
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  local_29a = 0;
  __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}